

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_simd_qshl(DisasContext_conflict1 *s,_Bool scalar,_Bool is_q,_Bool src_unsigned,
                     _Bool dst_unsigned,int immh,int immb,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  NeonGenTwo64OpEnvFn *pNVar1;
  NeonGenTwoOpEnvFn *pNVar2;
  _Bool _Var3;
  int iVar4;
  MemOp MVar5;
  uint32_t uVar6;
  TCGv_i64 arg;
  TCGv_i64 tcg_dest;
  TCGv_i32 arg_00;
  TCGv_i32 tcg_dest_00;
  int local_7c;
  MemOp local_78;
  TCGv_i32 tcg_op_1;
  int maxpass_1;
  MemOp memop;
  NeonGenTwoOpEnvFn *genfn_1;
  TCGv_i32 tcg_shift_1;
  TCGv_i64 tcg_op;
  int maxpass;
  NeonGenTwo64OpEnvFn *genfn;
  TCGv_i64 tcg_shift;
  int pass;
  int shift;
  int size;
  int immhb;
  TCGContext_conflict1 *tcg_ctx;
  int immh_local;
  _Bool dst_unsigned_local;
  _Bool src_unsigned_local;
  _Bool is_q_local;
  _Bool scalar_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar4 = clz32(immh);
  MVar5 = -iVar4 + (MO_ALIGN_2|MO_BESL|MO_16);
  tcg_shift._4_4_ = (immh << 3 | immb) - (8 << ((byte)MVar5 & 0x1f));
  if (immh == 0) {
    __assert_fail("immh != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x2141,
                  "void handle_simd_qshl(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int)"
                 );
  }
  if ((scalar) && (is_q)) {
    __assert_fail("!(scalar && is_q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x2142,
                  "void handle_simd_qshl(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int)"
                 );
  }
  if (!scalar) {
    if ((!is_q) && (uVar6 = extract32(immh,3,1), uVar6 != 0)) {
      unallocated_encoding_aarch64(s);
      return;
    }
    if (MVar5 == MO_8) {
      tcg_shift._4_4_ = tcg_shift._4_4_ * 0x100 | tcg_shift._4_4_;
    }
    else if (MVar5 != MO_16) {
      if (1 < -iVar4 + 0x1dU) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2159,(char *)0x0);
      }
      goto LAB_00845d89;
    }
    tcg_shift._4_4_ = tcg_shift._4_4_ << 0x10 | tcg_shift._4_4_;
  }
LAB_00845d89:
  _Var3 = fp_access_check(s);
  if (_Var3) {
    if (MVar5 == MO_64) {
      arg = tcg_const_i64_aarch64(tcg_ctx_00,(long)(int)tcg_shift._4_4_);
      pNVar1 = handle_simd_qshl::fns[src_unsigned][dst_unsigned];
      iVar4 = 1;
      if (is_q) {
        iVar4 = 2;
      }
      for (tcg_shift._0_4_ = 0; (int)tcg_shift < iVar4; tcg_shift._0_4_ = (int)tcg_shift + 1) {
        tcg_dest = tcg_temp_new_i64(tcg_ctx_00);
        read_vec_element(s,tcg_dest,rn,(int)tcg_shift,MO_64);
        (*pNVar1)(tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,tcg_dest,arg);
        write_vec_element(s,tcg_dest,rd,(int)tcg_shift,MO_64);
        tcg_temp_free_i64(tcg_ctx_00,tcg_dest);
      }
      tcg_temp_free_i64(tcg_ctx_00,arg);
      clear_vec_high(s,is_q,rd);
    }
    else {
      arg_00 = tcg_const_i32_aarch64(tcg_ctx_00,tcg_shift._4_4_);
      pNVar2 = handle_simd_qshl::fns_1[src_unsigned][dst_unsigned][(int)MVar5];
      if (scalar) {
        local_7c = 1;
        local_78 = MVar5;
      }
      else {
        local_78 = MO_32;
        local_7c = 2;
        if (is_q) {
          local_7c = 4;
        }
      }
      for (tcg_shift._0_4_ = 0; (int)tcg_shift < local_7c; tcg_shift._0_4_ = (int)tcg_shift + 1) {
        tcg_dest_00 = tcg_temp_new_i32(tcg_ctx_00);
        read_vec_element_i32(s,tcg_dest_00,rn,(int)tcg_shift,local_78);
        (*pNVar2)(tcg_ctx_00,tcg_dest_00,tcg_ctx_00->cpu_env,tcg_dest_00,arg_00);
        if (scalar) {
          if (MVar5 == MO_8) {
            tcg_gen_ext8u_i32_aarch64(tcg_ctx_00,tcg_dest_00,tcg_dest_00);
          }
          else if (MVar5 == MO_16) {
            tcg_gen_ext16u_i32_aarch64(tcg_ctx_00,tcg_dest_00,tcg_dest_00);
          }
          else if (MVar5 != MO_32) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x219a,(char *)0x0);
          }
          write_fp_sreg(s,rd,tcg_dest_00);
        }
        else {
          write_vec_element_i32(s,tcg_dest_00,rd,(int)tcg_shift,MO_32);
        }
        tcg_temp_free_i32(tcg_ctx_00,tcg_dest_00);
      }
      tcg_temp_free_i32(tcg_ctx_00,arg_00);
      if (!scalar) {
        clear_vec_high(s,is_q,rd);
      }
    }
  }
  return;
}

Assistant:

static void handle_simd_qshl(DisasContext *s, bool scalar, bool is_q,
                             bool src_unsigned, bool dst_unsigned,
                             int immh, int immb, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int shift = immhb - (8 << size);
    int pass;

    assert(immh != 0);
    assert(!(scalar && is_q));

    if (!scalar) {
        if (!is_q && extract32(immh, 3, 1)) {
            unallocated_encoding(s);
            return;
        }

        /* Since we use the variable-shift helpers we must
         * replicate the shift count into each element of
         * the tcg_shift value.
         */
        switch (size) {
        case 0:
            shift |= shift << 8;
            /* fall through */
        case 1:
            shift |= shift << 16;
            break;
        case 2:
        case 3:
            break;
        default:
            g_assert_not_reached();
        }
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_shift = tcg_const_i64(tcg_ctx, shift);
        static NeonGenTwo64OpEnvFn * const fns[2][2] = {
            { gen_helper_neon_qshl_s64, gen_helper_neon_qshlu_s64 },
            { NULL, gen_helper_neon_qshl_u64 },
        };
        NeonGenTwo64OpEnvFn *genfn = fns[src_unsigned][dst_unsigned];
        int maxpass = is_q ? 2 : 1;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            write_vec_element(s, tcg_op, rd, pass, MO_64);

            tcg_temp_free_i64(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_shift);
        clear_vec_high(s, is_q, rd);
    } else {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, shift);
        static NeonGenTwoOpEnvFn * const fns[2][2][3] = {
            {
                { gen_helper_neon_qshl_s8,
                  gen_helper_neon_qshl_s16,
                  gen_helper_neon_qshl_s32 },
                { gen_helper_neon_qshlu_s8,
                  gen_helper_neon_qshlu_s16,
                  gen_helper_neon_qshlu_s32 }
            }, {
                { NULL, NULL, NULL },
                { gen_helper_neon_qshl_u8,
                  gen_helper_neon_qshl_u16,
                  gen_helper_neon_qshl_u32 }
            }
        };
        NeonGenTwoOpEnvFn *genfn = fns[src_unsigned][dst_unsigned][size];
        MemOp memop = scalar ? size : MO_32;
        int maxpass = scalar ? 1 : is_q ? 4 : 2;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, memop);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            if (scalar) {
                switch (size) {
                case 0:
                    tcg_gen_ext8u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 1:
                    tcg_gen_ext16u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 2:
                    break;
                default:
                    g_assert_not_reached();
                }
                write_fp_sreg(s, rd, tcg_op);
            } else {
                write_vec_element_i32(s, tcg_op, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_shift);

        if (!scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
}